

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_12x12(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  JSAMPROW pJVar1;
  long lVar2;
  long lVar3;
  DCTELEM *pDVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  DCTELEM *local_f0;
  DCTELEM local_b8 [8];
  int aiStack_98 [8];
  int local_78 [8];
  int aiStack_58 [10];
  
  uVar14 = (ulong)start_col;
  lVar8 = 0;
  local_f0 = data;
  do {
    pJVar1 = sample_data[lVar8];
    uVar15 = (ulong)((uint)pJVar1[uVar14] + (uint)pJVar1[uVar14 + 0xb]);
    uVar20 = (ulong)((uint)pJVar1[uVar14 + 2] + (uint)pJVar1[uVar14 + 9]);
    uVar19 = (ulong)((uint)pJVar1[uVar14 + 3] + (uint)pJVar1[uVar14 + 8]);
    uVar6 = (ulong)((uint)pJVar1[uVar14 + 5] + (uint)pJVar1[uVar14 + 6]);
    lVar3 = uVar6 + uVar15;
    lVar16 = uVar15 - uVar6;
    lVar7 = uVar19 + uVar20;
    lVar21 = uVar20 - uVar19;
    lVar2 = (ulong)pJVar1[uVar14] - (ulong)pJVar1[uVar14 + 0xb];
    uVar9 = (uint)pJVar1[uVar14 + 1] + (uint)pJVar1[uVar14 + 10];
    lVar13 = (ulong)pJVar1[uVar14 + 1] - (ulong)pJVar1[uVar14 + 10];
    lVar10 = (ulong)pJVar1[uVar14 + 2] - (ulong)pJVar1[uVar14 + 9];
    lVar5 = (ulong)pJVar1[uVar14 + 3] - (ulong)pJVar1[uVar14 + 8];
    uVar18 = (uint)pJVar1[uVar14 + 4] + (uint)pJVar1[uVar14 + 7];
    lVar11 = (ulong)pJVar1[uVar14 + 4] - (ulong)pJVar1[uVar14 + 7];
    lVar17 = (ulong)pJVar1[uVar14 + 5] - (ulong)pJVar1[uVar14 + 6];
    lVar12 = (ulong)uVar9 - (ulong)uVar18;
    *local_f0 = (int)lVar3 + uVar18 + uVar9 + (int)lVar7 + -0x600;
    local_f0[6] = ((int)lVar16 - (int)lVar12) - (int)lVar21;
    local_f0[4] = (DCTELEM)((lVar3 - lVar7) * 0x2731 + 0x1000U >> 0xd);
    local_f0[2] = (DCTELEM)((ulong)(lVar12 + lVar21 * 0x2bb5 + 0x1000 + lVar16 * 0x2bb6) >> 0xd);
    lVar7 = (lVar11 + lVar13) * 0x1151;
    lVar12 = lVar13 * 0x187e + lVar7;
    lVar7 = lVar11 * -0x3b21 + lVar7;
    lVar11 = (lVar10 + lVar2) * 0x23e7;
    lVar3 = (lVar5 + lVar2) * 0x1b8d;
    local_f0[1] = (DCTELEM)((ulong)(lVar17 * 0x5e8 + lVar12 +
                                   lVar11 + lVar2 * 0x1fffffffed6a + 0x1000 + lVar3) >> 0xd);
    local_f0[3] = (DCTELEM)((lVar17 + lVar10) * 0x1fffffffeeaf + (lVar2 - lVar5) * 0x29cf + lVar7 +
                            0x1000U >> 0xd);
    lVar2 = (lVar5 + lVar10) * -0x5e8;
    local_f0[5] = (DCTELEM)((ulong)(((lVar11 + lVar10 * -0x4add + 0x1000 + lVar2) - lVar7) +
                                   lVar17 * 0x1b8d) >> 0xd);
    local_f0[7] = (DCTELEM)((ulong)(lVar17 * 0x1fffffffdc19 + 0x1000 +
                                   ((lVar5 * 0x173a + lVar3 + lVar2) - lVar12)) >> 0xd);
    pDVar4 = local_b8;
    if ((int)lVar8 != 7) {
      if ((int)lVar8 == 0xb) {
        lVar8 = 0;
        do {
          lVar5 = (long)(aiStack_58[lVar8] + data[lVar8]);
          lVar21 = (long)(aiStack_98[lVar8] + data[lVar8 + 0x10]);
          lVar2 = (long)(local_b8[lVar8] + data[lVar8 + 0x18]);
          lVar7 = (long)(data[lVar8 + 0x28] + data[lVar8 + 0x30]);
          lVar3 = lVar5 + lVar7;
          lVar5 = lVar5 - lVar7;
          lVar7 = lVar2 + lVar21;
          lVar21 = lVar21 - lVar2;
          lVar12 = (long)(local_78[lVar8] + data[lVar8 + 8]);
          lVar22 = (long)(data[lVar8 + 0x38] + data[lVar8 + 0x20]);
          lVar11 = lVar12 - lVar22;
          lVar23 = (long)(data[lVar8] - aiStack_58[lVar8]);
          lVar10 = (long)(data[lVar8 + 8] - local_78[lVar8]);
          lVar16 = (long)(data[lVar8 + 0x10] - aiStack_98[lVar8]);
          lVar13 = (long)(data[lVar8 + 0x18] - local_b8[lVar8]);
          lVar2 = (long)(data[lVar8 + 0x20] - data[lVar8 + 0x38]);
          lVar17 = (long)(data[lVar8 + 0x28] - data[lVar8 + 0x30]);
          data[lVar8] = (DCTELEM)((lVar12 + lVar22 + lVar7 + lVar3) * 0x1c72 + 0x2000U >> 0xe);
          data[lVar8 + 0x30] = (DCTELEM)((lVar5 - (lVar11 + lVar21)) * 0x1c72 + 0x2000U >> 0xe);
          data[lVar8 + 0x20] = (DCTELEM)((lVar3 - lVar7) * 0x22d6 + 0x2000U >> 0xe);
          data[lVar8 + 0x10] =
               (DCTELEM)(lVar21 * 0xa69 + lVar5 * 0x26db + lVar11 * 0x1c72 + 0x2000U >> 0xe);
          lVar3 = (lVar2 + lVar10) * 0xf65;
          lVar5 = lVar10 * 0x15c5 + lVar3;
          lVar3 = lVar2 * -0x348f + lVar3;
          lVar7 = (lVar16 + lVar23) * 0x1fea;
          lVar2 = (lVar13 + lVar23) * 0x187d;
          data[lVar8 + 8] =
               (DCTELEM)((ulong)(lVar17 * 0x540 + lVar5 +
                                lVar23 * 0x3fffffffef7b + lVar7 + 0x2000 + lVar2) >> 0xe);
          data[lVar8 + 0x18] =
               (DCTELEM)((lVar17 + lVar16) * 0x3ffffffff09b + (lVar23 - lVar13) * 0x252a + lVar3 +
                         0x2000U >> 0xe);
          lVar10 = (lVar16 + lVar13) * -0x540;
          data[lVar8 + 0x28] =
               (DCTELEM)((ulong)(((lVar7 + lVar16 * -0x428c + 0x2000 + lVar10) - lVar3) +
                                lVar17 * 0x187d) >> 0xe);
          data[lVar8 + 0x38] =
               (DCTELEM)((ulong)(lVar17 * 0x3fffffffe016 + 0x2000 +
                                ((lVar13 * 0x14a5 + lVar2 + lVar10) - lVar5)) >> 0xe);
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 8);
        return;
      }
      pDVar4 = local_f0 + 8;
    }
    lVar8 = lVar8 + 1;
    local_f0 = pDVar4;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_12x12 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  DCTELEM workspace[8*4];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/24). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[6]);

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) (tmp10 + tmp11 + tmp12 - 12 * CENTERJSAMPLE);
    dataptr[6] = (DCTELEM) (tmp13 - tmp14 - tmp15);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.224744871)), /* c4 */
	      CONST_BITS);
    dataptr[2] = (DCTELEM)
      DESCALE(tmp14 - tmp15 + MULTIPLY(tmp13 + tmp15, FIX(1.366025404)), /* c2 */
	      CONST_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX_0_541196100);    /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX_0_765366865);   /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX_1_847759065);   /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.121971054));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.860918669));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.580774953)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.184591911));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.184591911)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.339493912)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.860918669));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.725788011)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(1.121971054));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.306562965)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX_0_541196100);  /* c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 12)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/12)**2 = 4/9, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/24) * 8/9.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*2];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*1];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*0];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*7];
    tmp5 = dataptr[DCTSIZE*5] + dataptr[DCTSIZE*6];

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*2];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*1];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*0];
    tmp4 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*7];
    tmp5 = dataptr[DCTSIZE*5] - dataptr[DCTSIZE*6];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12, FIX(0.888888889)), /* 8/9 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(MULTIPLY(tmp13 - tmp14 - tmp15, FIX(0.888888889)), /* 8/9 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.088662108)),         /* c4 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp14 - tmp15, FIX(0.888888889)) +        /* 8/9 */
	      MULTIPLY(tmp13 + tmp15, FIX(1.214244803)),         /* c2 */
	      CONST_BITS+1);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX(0.481063200));   /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX(0.680326102));  /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX(1.642452502));  /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(0.997307603));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.765261039));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.516244403)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.164081699));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.164081699)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.079550144)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.765261039));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.645144899)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(0.997307603));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.161389302)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX(0.481063200)); /* c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}